

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeFloatingState.cpp
# Opt level: O2

void __thiscall iDynTree::FreeFloatingVel::resize(FreeFloatingVel *this,Model *model)

{
  size_t nrOfDOFs;
  
  SpatialVector<iDynTree::SpatialMotionVector>::zero
            ((SpatialVector<iDynTree::SpatialMotionVector> *)&this->m_baseVel);
  nrOfDOFs = Model::getNrOfDOFs(model);
  JointDOFsDoubleArray::resize(&this->m_jointVel,nrOfDOFs);
  iDynTree::VectorDynSize::zero();
  return;
}

Assistant:

void FreeFloatingVel::resize(const Model& model)
{
    this->m_baseVel.zero();
    this->m_jointVel.resize(model.getNrOfDOFs());
    this->m_jointVel.zero();
}